

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_file.cpp
# Opt level: O2

int write_normal_fill_chunk(output_file *out,uint len,uint32_t fill_val)

{
  uint i;
  int iVar1;
  ulong uVar2;
  uint uVar3;
  
  for (uVar2 = 0; uVar2 < out->block_size >> 2; uVar2 = uVar2 + 1) {
    out->fill_buf[uVar2] = fill_val;
  }
  do {
    if (len == 0) {
      return 0;
    }
    uVar3 = out->block_size;
    if (len <= out->block_size) {
      uVar3 = len;
    }
    iVar1 = (*out->ops->write)(out,out->fill_buf,(size_t)uVar3);
    len = len - uVar3;
  } while (-1 < iVar1);
  return iVar1;
}

Assistant:

static int write_normal_fill_chunk(struct output_file* out, unsigned int len, uint32_t fill_val) {
  int ret;
  unsigned int i;
  unsigned int write_len;

  /* Initialize fill_buf with the fill_val */
  for (i = 0; i < out->block_size / sizeof(uint32_t); i++) {
    out->fill_buf[i] = fill_val;
  }

  while (len) {
    write_len = std::min(len, out->block_size);
    ret = out->ops->write(out, out->fill_buf, write_len);
    if (ret < 0) {
      return ret;
    }

    len -= write_len;
  }

  return 0;
}